

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpool.c
# Opt level: O2

void mpool_free(mpool *pool)

{
  mpool_block *pmVar1;
  mpool_block *__ptr;
  
  if (pool == (mpool *)0x0) {
    return;
  }
  __ptr = pool->block;
  if (pool->block != (mpool_block *)0x0) {
    while (__ptr != (mpool_block *)0x0) {
      pmVar1 = __ptr->next;
      free(__ptr->bp);
      free(__ptr);
      __ptr = pmVar1;
    }
  }
  free(pool);
  return;
}

Assistant:

void mpool_free (struct mpool *pool)
{
    struct mpool_block *p, *p_next;

    if (!pool)
        return;

    if (!pool->block) {
        free(pool);
	       return;
    }

    p = pool->block;

    while (p) {
    	p_next = p->next;
    	free(p->bp);
    	free(p);
    	p = p_next;
    }

    free(pool);
}